

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

void __thiscall
NNTreeIterator::split(NNTreeIterator *this,QPDFObjectHandle *to_split,iterator parent)

{
  list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_> *this_00;
  QPDFObjectHandle *pQVar1;
  NNTreeIterator *pNVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  string *psVar7;
  int *piVar8;
  _List_node_base *p_Var9;
  logic_error *plVar10;
  _List_node_base *p_Var11;
  iterator iVar12;
  allocator<char> local_171;
  NNTreeIterator *local_170;
  string *local_168;
  QPDFObjectHandle second_node;
  QPDFObjectHandle second_half;
  QPDFObjectHandle next;
  QPDFObjectHandle first_half;
  QPDFObjectHandle parent_kids;
  QPDFObjectHandle items;
  QPDFObjectHandle kids;
  string key;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_168 = (string *)to_split;
  if (this->item_number < 0) {
    plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar10,"NNTreeIterator::split called an invalid iterator");
    __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&key,"/Kids",(allocator<char> *)&next);
  QPDFObjectHandle::getKey(&kids,local_168);
  std::__cxx11::string::~string((string *)&key);
  bVar3 = QPDFObjectHandle::isArray(&kids);
  uVar4 = 0;
  if (bVar3) {
    uVar4 = QPDFObjectHandle::getArrayNItems(&kids);
  }
  (*(code *)**(undefined8 **)this->impl->details)();
  QPDFObjectHandle::getKey(&items,local_168);
  bVar3 = QPDFObjectHandle::isArray(&items);
  uVar5 = 0;
  if (bVar3) {
    uVar5 = QPDFObjectHandle::getArrayNItems(&items);
  }
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  first_half.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  first_half.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  key.field_2._M_local_buf[0] = '\0';
  if ((int)uVar4 < 1) {
    if ((int)uVar5 < 1) {
      plVar10 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar10,"NNTreeIterator::split called on invalid node");
      __cxa_throw(plVar10,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&first_half,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&items);
    iVar6 = this->impl->split_threshold;
    (*(code *)**(undefined8 **)this->impl->details)();
    std::__cxx11::string::_M_assign((string *)&key);
    iVar6 = iVar6 * 2;
    uVar4 = uVar5;
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&first_half,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&kids);
    iVar6 = this->impl->split_threshold;
    std::__cxx11::string::assign((char *)&key);
  }
  if (iVar6 < (int)uVar4) {
    this_00 = &this->path;
    iVar12._M_node = parent._M_node;
    local_170 = this;
    if ((_List_node_base *)this_00 == parent._M_node) {
      pQVar1 = (QPDFObjectHandle *)this->impl->qpdf;
      QPDFObjectHandle::newDictionary();
      QPDF::makeIndirectObject((QPDF *)&second_half,pQVar1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      QPDFObjectHandle::replaceKey(&second_half,&key,&first_half);
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::appendItem(&second_node,&second_half);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&next,"/Limits",(allocator<char> *)&parent_kids);
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_168,(string *)&next);
      std::__cxx11::string::~string((string *)&next);
      psVar7 = (string *)(*(code *)**(undefined8 **)this->impl->details)();
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_168,psVar7);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&next,"/Kids",(allocator<char> *)&parent_kids);
      psVar7 = local_168;
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_168,(string *)&next,&second_node);
      std::__cxx11::string::~string((string *)&next);
      p_Var11 = (_List_node_base *)&this->node;
      if ((int)uVar5 < 1) {
        p_Var11 = (this->path).
                  super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
                  ._M_impl._M_node.super__List_node_base._M_next + 1;
      }
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)p_Var11,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&second_half);
      next.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
      _0_4_ = 0;
      std::__cxx11::list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>>::
      emplace_front<QPDFObjectHandle&,int>
                ((list<NNTreeIterator::PathElement,std::allocator<NNTreeIterator::PathElement>> *)
                 this_00,(QPDFObjectHandle *)psVar7,(int *)&next);
      iVar12._M_node =
           (this_00->
           super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
           )._M_impl._M_node.super__List_node_base._M_next;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)psVar7,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&second_half);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&second_node.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&second_half.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    QPDFObjectHandle::newArray();
    piVar8 = &local_170->item_number;
    uVar4 = uVar4 >> 1 & 0x3ffffffe;
    while( true ) {
      iVar6 = QPDFObjectHandle::getArrayNItems(&first_half);
      if (iVar6 <= (int)uVar4) break;
      QPDFObjectHandle::getArrayItem(&next,(int)&first_half);
      QPDFObjectHandle::appendItem(&second_half,&next);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&next.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFObjectHandle::eraseItem(&first_half,uVar4);
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_168);
    pNVar2 = local_170;
    resetLimits(local_170,(QPDFObjectHandle *)&local_40,iVar12);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    pQVar1 = (QPDFObjectHandle *)pNVar2->impl->qpdf;
    QPDFObjectHandle::newDictionary();
    QPDF::makeIndirectObject((QPDF *)&second_node,pQVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
    QPDFObjectHandle::replaceKey(&second_node,&key,&second_half);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&second_node);
    resetLimits(local_170,(QPDFObjectHandle *)&local_50,iVar12);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__cxx11::string::string<std::allocator<char>>((string *)&next,"/Kids",&local_171);
    QPDFObjectHandle::getKey(&parent_kids,(string *)(iVar12._M_node + 1));
    std::__cxx11::string::~string((string *)&next);
    QPDFObjectHandle::insertItem(&parent_kids,*(int *)&iVar12._M_node[2]._M_next + 1,&second_node);
    p_Var11 = (iVar12._M_node)->_M_next;
    p_Var9 = p_Var11 + 2;
    if (0 < (int)uVar5) {
      p_Var9 = (_List_node_base *)piVar8;
    }
    if ((int)uVar4 <= *(int *)&p_Var9->_M_next) {
      *(int *)&iVar12._M_node[2]._M_next = *(int *)&iVar12._M_node[2]._M_next + 1;
      if ((int)uVar5 < 1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(p_Var11 + 1),
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&second_node);
        *(uint *)&p_Var11[2]._M_next = *(int *)&p_Var11[2]._M_next - uVar4;
      }
      else {
        setItemNumber(local_170,&second_node,local_170->item_number - uVar4);
      }
    }
    if ((_List_node_base *)this_00 != parent._M_node) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&next,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar12._M_node + 1));
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&next);
      pNVar2 = local_170;
      resetLimits(local_170,(QPDFObjectHandle *)&local_60,iVar12);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      iVar12._M_node = (iVar12._M_node)->_M_prev;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&next);
      split(pNVar2,(QPDFObjectHandle *)&local_70,iVar12);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&next.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parent_kids.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&second_node.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&second_half.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::~string((string *)&key);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&first_half.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&kids.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
NNTreeIterator::split(QPDFObjectHandle to_split, std::list<PathElement>::iterator parent)
{
    // Split some node along the path to the item pointed to by this iterator, and adjust the
    // iterator so it points to the same item.

    // In examples, for simplicity, /Nums is shown to just contain numbers instead of pairs. Imagine
    // this tree:
    //
    // root: << /Kids [ A B C D ] >>
    // A: << /Nums [ 1 2 3 4 ] >>
    // B: << /Nums [ 5 6 7 8 ] >>
    // C: << /Nums [ 9 10 11 12 ] >>
    // D: << /Kids [ E F ]
    // E: << /Nums [ 13 14 15 16 ] >>
    // F: << /Nums [ 17 18 19 20 ] >>

    // iter1 (points to 19)
    //   path:
    //   - { node: root: kid_number: 3 }
    //   - { node: D, kid_number: 1 }
    //   node: F
    //   item_number: 2

    // iter2 (points to 1)
    //   path:
    //   - { node: root, kid_number: 0}
    //   node: A
    //   item_number: 0

    if (!valid()) {
        throw std::logic_error("NNTreeIterator::split called an invalid iterator");
    }

    // Find the array we actually need to split, which is either this node's kids or items.
    auto kids = to_split.getKey("/Kids");
    int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
    auto items = to_split.getKey(impl.details.itemsKey());
    int nitems = items.isArray() ? items.getArrayNItems() : 0;

    QPDFObjectHandle first_half;
    int n = 0;
    std::string key;
    int threshold = 0;
    if (nkids > 0) {
        QTC::TC("qpdf", "NNTree split kids");
        first_half = kids;
        n = nkids;
        threshold = impl.split_threshold;
        key = "/Kids";
    } else if (nitems > 0) {
        QTC::TC("qpdf", "NNTree split items");
        first_half = items;
        n = nitems;
        threshold = 2 * impl.split_threshold;
        key = impl.details.itemsKey();
    } else {
        throw std::logic_error("NNTreeIterator::split called on invalid node");
    }

    if (n <= threshold) {
        return;
    }

    bool is_root = (parent == this->path.end());
    bool is_leaf = (nitems > 0);

    // CURRENT STATE: tree is in original state; iterator is valid and unchanged.

    if (is_root) {
        // What we want to do is to create a new node for the second half of the items and put it in
        // the parent's /Kids array right after the element that points to the current to_split
        // node, but if we're splitting root, there is no parent, so handle that first.

        // In the non-root case, parent points to the path element whose /Kids contains the first
        // half node, and the first half node is to_split. If we are splitting the root, we need to
        // push everything down a level, but we want to keep the actual root object the same so that
        // indirect references to it remain intact (and also in case it might be a direct object,
        // which it shouldn't be but that case probably exists in the wild). To achieve this, we
        // create a new node for the first half and then replace /Kids in the root to contain it.
        // Then we adjust the path so that the first element is root and the second element, if any,
        // is the new first half. In this way, we make the root case identical to the non-root case
        // so remaining logic can handle them in the same way.

        auto first_node = impl.qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary());
        first_node.replaceKey(key, first_half);
        QPDFObjectHandle new_kids = QPDFObjectHandle::newArray();
        new_kids.appendItem(first_node);
        to_split.removeKey("/Limits"); // already shouldn't be there for root
        to_split.removeKey(impl.details.itemsKey());
        to_split.replaceKey("/Kids", new_kids);
        if (is_leaf) {
            QTC::TC("qpdf", "NNTree split root + leaf");
            this->node = first_node;
        } else {
            QTC::TC("qpdf", "NNTree split root + !leaf");
            auto next = this->path.begin();
            next->node = first_node;
        }
        this->path.emplace_front(to_split, 0);
        parent = this->path.begin();
        to_split = first_node;
    }

    // CURRENT STATE: parent is guaranteed to be defined, and we have the invariants that
    // parent[/Kids][kid_number] == to_split and (++parent).node == to_split.

    // Create a second half array, and transfer the second half of the items into the second half
    // array.
    QPDFObjectHandle second_half = QPDFObjectHandle::newArray();
    int start_idx = ((n / 2) & ~1);
    while (first_half.getArrayNItems() > start_idx) {
        second_half.appendItem(first_half.getArrayItem(start_idx));
        first_half.eraseItem(start_idx);
    }
    resetLimits(to_split, parent);

    // Create a new node to contain the second half
    QPDFObjectHandle second_node = impl.qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary());
    second_node.replaceKey(key, second_half);
    resetLimits(second_node, parent);

    // CURRENT STATE: half the items from the kids or items array in the node being split have been
    // moved into a new node. The new node is not yet attached to the tree. The iterator may have a
    // path element or leaf node that is out of bounds.

    // We need to adjust the parent to add the second node to /Kids and, if needed, update
    // kid_number to traverse through it. We need to update to_split's path element, or the node if
    // this is a leaf, so that the kid/item number points to the right place.

    auto parent_kids = parent->node.getKey("/Kids");
    parent_kids.insertItem(parent->kid_number + 1, second_node);
    auto cur_elem = parent;
    ++cur_elem; // points to end() for leaf nodes
    int old_idx = (is_leaf ? this->item_number : cur_elem->kid_number);
    if (old_idx >= start_idx) {
        ++parent->kid_number;
        if (is_leaf) {
            QTC::TC("qpdf", "NNTree split second half item");
            setItemNumber(second_node, this->item_number - start_idx);
        } else {
            QTC::TC("qpdf", "NNTree split second half kid");
            cur_elem->node = second_node;
            cur_elem->kid_number -= start_idx;
        }
    }
    if (!is_root) {
        QTC::TC("qpdf", "NNTree split parent");
        auto next = parent->node;
        resetLimits(next, parent);
        --parent;
        split(next, parent);
    }
}